

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParserTest.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::MakefileDepsParserTest_basic_Test::TestBody()::Testactions::error(llvm::
StringRef_unsigned_long_(void *this,StringRef message,uint64_t position)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  uint64_t local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar2 = message.Data;
  paVar1 = &local_38.field_2;
  local_40 = position;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  if (pcVar2 == (char *)0x0) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,pcVar2,pcVar2 + message.Length);
  }
  std::
  vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
  ::emplace_back<std::__cxx11::string,unsigned_long&>
            ((vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
              *)((long)this + 0x20),&local_38,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
      errors.emplace_back(message.str(), position);
    }